

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

char * phosg::name_for_enum<phosg::LogLevel>(LogLevel level)

{
  invalid_argument *this;
  char *pcStack_10;
  LogLevel level_local;
  
  switch(level) {
  case DEBUG:
    pcStack_10 = "DEBUG";
    break;
  case INFO:
    pcStack_10 = "INFO";
    break;
  case WARNING:
    pcStack_10 = "WARNING";
    break;
  case ERROR:
    pcStack_10 = "ERROR";
    break;
  case DISABLED:
    pcStack_10 = "DISABLED";
    break;
  case USE_DEFAULT:
    pcStack_10 = "USE_DEFAULT";
    break;
  default:
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument(this,"invalid LogLevel value");
    __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
  }
  return pcStack_10;
}

Assistant:

const char* name_for_enum<LogLevel>(LogLevel level) {
  switch (level) {
    case LogLevel::USE_DEFAULT:
      return "USE_DEFAULT";
    case LogLevel::DEBUG:
      return "DEBUG";
    case LogLevel::INFO:
      return "INFO";
    case LogLevel::WARNING:
      return "WARNING";
    case LogLevel::ERROR:
      return "ERROR";
    case LogLevel::DISABLED:
      return "DISABLED";
    default:
      throw invalid_argument("invalid LogLevel value");
  }
}